

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O1

Error __thiscall
asmjit::BaseCompiler::_newFuncNode(BaseCompiler *this,FuncNode **out,FuncSignature *signature)

{
  Error EVar1;
  uint32_t uVar2;
  Error extraout_EAX;
  Error EVar3;
  FuncNode *node;
  SentinelNode *pSVar4;
  ArgPack *__s;
  BaseCompiler *unaff_RBX;
  FuncSignature *unaff_RBP;
  ZoneAllocator *unaff_R13;
  FuncNode **unaff_R14;
  Error unaff_R15D;
  size_t local_40;
  EVP_PKEY_CTX *local_38;
  
  *out = (FuncNode *)0x0;
  if ((this->super_BaseBuilder)._allocator._zone == (Zone *)0x0) {
    _newFuncNode();
LAB_001164c8:
    EVar1 = unaff_R15D;
    node = (FuncNode *)0x0;
  }
  else {
    unaff_R13 = &(this->super_BaseBuilder)._allocator;
    node = (FuncNode *)ZoneAllocator::_alloc(unaff_R13,0x248,&local_40);
    EVar1 = 0;
    unaff_RBX = this;
    unaff_RBP = signature;
    unaff_R14 = out;
    unaff_R15D = 0;
    if (node == (FuncNode *)0x0) goto LAB_001164c8;
    (node->super_LabelNode).super_BaseNode.field_0.field_0._prev = (BaseNode *)0x0;
    (node->super_LabelNode).super_BaseNode.field_0.field_0._next = (BaseNode *)0x0;
    (node->super_LabelNode).super_BaseNode.field_1._any._nodeType = '\x03';
    (node->super_LabelNode).super_BaseNode.field_1._any._nodeFlags =
         (byte)(this->super_BaseBuilder)._nodeFlags | 0x50;
    memset((void *)((long)&(node->super_LabelNode).super_BaseNode.field_1 + 2),0,0x21e);
    (node->_frame)._spRegId = 0xff;
    (node->_frame)._saRegId = 0xff;
    (node->_frame)._daOffset = 0xffffffff;
    node->_exitNode = (LabelNode *)0x0;
    node->_end = (SentinelNode *)0x0;
    node->_args = (ArgPack *)0x0;
    (node->super_LabelNode).super_BaseNode.field_1._any._nodeType = '\x10';
  }
  if (node == (FuncNode *)0x0) {
    EVar1 = BaseEmitter::reportError((BaseEmitter *)unaff_RBX,1,(char *)0x0);
  }
  if (EVar1 != 0) {
    return EVar1;
  }
  EVar1 = BaseBuilder::_newLabelNode(&unaff_RBX->super_BaseBuilder,&node->_exitNode);
  if (EVar1 != 0) {
    return EVar1;
  }
  if (unaff_R13->_zone == (Zone *)0x0) {
    _newFuncNode();
    EVar1 = extraout_EAX;
LAB_001164ec:
    EVar3 = EVar1;
    pSVar4 = (SentinelNode *)0x0;
  }
  else {
    pSVar4 = (SentinelNode *)ZoneAllocator::_alloc(unaff_R13,0x30,&local_40);
    EVar3 = 0;
    EVar1 = 0;
    if (pSVar4 == (SentinelNode *)0x0) goto LAB_001164ec;
    (pSVar4->super_BaseNode).field_0.field_0._prev = (BaseNode *)0x0;
    (pSVar4->super_BaseNode).field_0.field_0._next = (BaseNode *)0x0;
    (pSVar4->super_BaseNode).field_1._any._nodeType = '\n';
    (pSVar4->super_BaseNode).field_1._any._nodeFlags =
         (byte)(unaff_RBX->super_BaseBuilder)._nodeFlags | 0x14;
    *(undefined8 *)((long)&(pSVar4->super_BaseNode).field_1 + 2) = 0;
    *(undefined8 *)((long)&(pSVar4->super_BaseNode).field_3 + 2) = 0;
    (pSVar4->super_BaseNode)._passData = (void *)0x0;
    (pSVar4->super_BaseNode)._inlineComment = (char *)0x0;
    (pSVar4->super_BaseNode).field_1._any._reserved0 = '\x01';
  }
  node->_end = pSVar4;
  if (pSVar4 == (SentinelNode *)0x0) {
    EVar3 = BaseEmitter::reportError((BaseEmitter *)unaff_RBX,1,(char *)0x0);
  }
  if (EVar3 != 0) {
    return EVar3;
  }
  local_38 = (EVP_PKEY_CTX *)&(node->super_LabelNode).field_0x34;
  EVar1 = FuncDetail::init((FuncDetail *)local_38,(EVP_PKEY_CTX *)unaff_RBP);
  if (EVar1 == 0) {
    uVar2 = Environment::stackAlignment
                      (&(unaff_RBX->super_BaseBuilder).super_BaseEmitter._environment);
    if ((byte)node->field_0x39 < uVar2) {
      node->field_0x39 = (char)uVar2;
    }
    EVar1 = FuncFrame::init(&node->_frame,local_38);
    if (EVar1 == 0) {
      node->_args = (ArgPack *)0x0;
      if (node->field_0xa4 == 0) {
LAB_00116498:
        EVar1 = BaseBuilder::registerLabelNode(&unaff_RBX->super_BaseBuilder,&node->super_LabelNode)
        ;
        if (EVar1 != 0) {
          return EVar1;
        }
        *unaff_R14 = node;
        return 0;
      }
      if (unaff_R13->_zone == (Zone *)0x0) {
        _newFuncNode();
      }
      else {
        __s = (ArgPack *)
              ZoneAllocator::_alloc(unaff_R13,(ulong)(byte)node->field_0xa4 << 5,&local_40);
        node->_args = __s;
        if (__s != (ArgPack *)0x0) {
          memset(__s,0,(ulong)(byte)node->field_0xa4 << 5);
          goto LAB_00116498;
        }
      }
      EVar1 = 1;
    }
  }
  EVar1 = BaseEmitter::reportError((BaseEmitter *)unaff_RBX,EVar1,(char *)0x0);
  return EVar1;
}

Assistant:

Error BaseCompiler::_newFuncNode(FuncNode** out, const FuncSignature& signature) {
  *out = nullptr;

  // Create FuncNode together with all the required surrounding nodes.
  FuncNode* funcNode;
  ASMJIT_PROPAGATE(_newNodeT<FuncNode>(&funcNode));
  ASMJIT_PROPAGATE(_newLabelNode(&funcNode->_exitNode));
  ASMJIT_PROPAGATE(_newNodeT<SentinelNode>(&funcNode->_end, SentinelNode::kSentinelFuncEnd));

  // Initialize the function's detail info.
  Error err = funcNode->detail().init(signature, environment());
  if (ASMJIT_UNLIKELY(err))
    return reportError(err);

  // If the Target guarantees greater stack alignment than required by the
  // calling convention then override it as we can prevent having to perform
  // dynamic stack alignment
  uint32_t environmentStackAlignment = _environment.stackAlignment();

  if (funcNode->_funcDetail._callConv.naturalStackAlignment() < environmentStackAlignment)
    funcNode->_funcDetail._callConv.setNaturalStackAlignment(environmentStackAlignment);

  // Initialize the function frame.
  err = funcNode->_frame.init(funcNode->_funcDetail);
  if (ASMJIT_UNLIKELY(err))
    return reportError(err);

  // Allocate space for function arguments.
  funcNode->_args = nullptr;
  if (funcNode->argCount() != 0) {
    funcNode->_args = _allocator.allocT<FuncNode::ArgPack>(funcNode->argCount() * sizeof(FuncNode::ArgPack));
    if (ASMJIT_UNLIKELY(!funcNode->_args))
      return reportError(DebugUtils::errored(kErrorOutOfMemory));
    memset(funcNode->_args, 0, funcNode->argCount() * sizeof(FuncNode::ArgPack));
  }

  ASMJIT_PROPAGATE(registerLabelNode(funcNode));

  *out = funcNode;
  return kErrorOk;
}